

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall picojson::default_parse_context::parse_object_start(default_parse_context *this)

{
  _storage _Var1;
  int iVar2;
  value *pvVar3;
  value local_20;
  
  value::value(&local_20,5,false);
  pvVar3 = this->out_;
  iVar2 = pvVar3->type_;
  pvVar3->type_ = local_20.type_;
  _Var1 = pvVar3->u_;
  pvVar3->u_ = local_20.u_;
  local_20.type_ = iVar2;
  local_20.u_ = _Var1;
  value::clear(&local_20);
  return true;
}

Assistant:

bool parse_object_start() {
    *out_ = value(object_type, false);
    return true;
  }